

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void __thiscall Assimp::JSONWriter::Key(JSONWriter *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  AddIndentation(this);
  Delimit(this);
  std::operator+(&local_38,'\"',name);
  std::operator+(&bStack_58,&local_38,"\": ");
  std::operator<<((ostream *)&this->field_0x58,(string *)&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Key(const std::string& name) {
        AddIndentation();
        Delimit();
        buff << '\"' + name + "\": ";
    }